

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O1

void __thiscall
Kernel::InterpretedLiteralEvaluator::InterpretedLiteralEvaluator
          (InterpretedLiteralEvaluator *this,bool doNormalize)

{
  EvalStack *this_00;
  Evaluator ***pppEVar1;
  Signature *pSVar2;
  uint uVar3;
  Evaluator *pEVar4;
  OperatorType *pOVar5;
  Evaluator **ppEVar6;
  
  (this->super_BottomUpTermTransformer).super_TermTransformerCommon._vptr_TermTransformerCommon =
       (_func_int **)&PTR_transform_00b67c10;
  this_00 = &this->_evals;
  (this->_evals)._capacity = 0;
  (this->_evals)._stack = (Evaluator **)0x0;
  (this->_evals)._cursor = (Evaluator **)0x0;
  (this->_evals)._end = (Evaluator **)0x0;
  (this->_funEvaluators)._size = 0;
  (this->_funEvaluators)._capacity = 0;
  (this->_funEvaluators)._array = (Evaluator **)0x0;
  (this->_predEvaluators)._size = 0;
  (this->_predEvaluators)._capacity = 0;
  (this->_predEvaluators)._array = (Evaluator **)0x0;
  this->_normalize = doNormalize;
  pEVar4 = (Evaluator *)::operator_new(8);
  pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67c78;
  ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
  *(this->_evals)._cursor = pEVar4;
  ppEVar6 = (this->_evals)._cursor + 1;
  (this->_evals)._cursor = ppEVar6;
  pEVar4 = (Evaluator *)::operator_new(8);
  pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67d28;
  if (ppEVar6 == (this->_evals)._end) {
    ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
  }
  *(this->_evals)._cursor = pEVar4;
  ppEVar6 = (this->_evals)._cursor + 1;
  (this->_evals)._cursor = ppEVar6;
  pEVar4 = (Evaluator *)::operator_new(8);
  pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67dc8;
  if (ppEVar6 == (this->_evals)._end) {
    ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
  }
  *(this->_evals)._cursor = pEVar4;
  ppEVar6 = (this->_evals)._cursor + 1;
  (this->_evals)._cursor = ppEVar6;
  pEVar4 = (Evaluator *)::operator_new(8);
  pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67e68;
  if (ppEVar6 == (this->_evals)._end) {
    ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
  }
  *(this->_evals)._cursor = pEVar4;
  ppEVar6 = (this->_evals)._cursor + 1;
  (this->_evals)._cursor = ppEVar6;
  pEVar4 = (Evaluator *)::operator_new(8);
  pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67ec0;
  if (ppEVar6 == (this->_evals)._end) {
    ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
  }
  *(this->_evals)._cursor = pEVar4;
  pppEVar1 = &(this->_evals)._cursor;
  *pppEVar1 = *pppEVar1 + 1;
  if ((*(char *)(::Lib::env + 0xaa6a) == '\x01') && (*(char *)(::Lib::env + 0xe582) == '\0')) {
    pEVar4 = (Evaluator *)::operator_new(0x10);
    pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67f18;
    pSVar2 = DAT_00b7e1b0;
    pOVar5 = Theory::getNonpolymorphicOperatorType(INT_PLUS);
    uVar3 = Signature::getInterpretingSymbol(pSVar2,INT_PLUS,pOVar5);
    *(uint *)&pEVar4[1]._vptr_Evaluator = uVar3;
    if ((this->_evals)._cursor == (this->_evals)._end) {
      ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
    }
    *(this->_evals)._cursor = pEVar4;
    pppEVar1 = &(this->_evals)._cursor;
    *pppEVar1 = *pppEVar1 + 1;
    pEVar4 = (Evaluator *)::operator_new(0x10);
    pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67f70;
    pSVar2 = DAT_00b7e1b0;
    pOVar5 = Theory::getNonpolymorphicOperatorType(INT_MULTIPLY);
    uVar3 = Signature::getInterpretingSymbol(pSVar2,INT_MULTIPLY,pOVar5);
    *(uint *)&pEVar4[1]._vptr_Evaluator = uVar3;
    if ((this->_evals)._cursor == (this->_evals)._end) {
      ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
    }
    *(this->_evals)._cursor = pEVar4;
    pppEVar1 = &(this->_evals)._cursor;
    *pppEVar1 = *pppEVar1 + 1;
    pEVar4 = (Evaluator *)::operator_new(0x10);
    pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b67fc8;
    pSVar2 = DAT_00b7e1b0;
    pOVar5 = Theory::getNonpolymorphicOperatorType(RAT_PLUS);
    uVar3 = Signature::getInterpretingSymbol(pSVar2,RAT_PLUS,pOVar5);
    *(uint *)&pEVar4[1]._vptr_Evaluator = uVar3;
    if ((this->_evals)._cursor == (this->_evals)._end) {
      ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
    }
    *(this->_evals)._cursor = pEVar4;
    pppEVar1 = &(this->_evals)._cursor;
    *pppEVar1 = *pppEVar1 + 1;
    pEVar4 = (Evaluator *)::operator_new(0x10);
    pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b68020;
    pSVar2 = DAT_00b7e1b0;
    pOVar5 = Theory::getNonpolymorphicOperatorType(RAT_MULTIPLY);
    uVar3 = Signature::getInterpretingSymbol(pSVar2,RAT_MULTIPLY,pOVar5);
    *(uint *)&pEVar4[1]._vptr_Evaluator = uVar3;
    if ((this->_evals)._cursor == (this->_evals)._end) {
      ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
    }
    *(this->_evals)._cursor = pEVar4;
    pppEVar1 = &(this->_evals)._cursor;
    *pppEVar1 = *pppEVar1 + 1;
    pEVar4 = (Evaluator *)::operator_new(0x10);
    pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b68078;
    pSVar2 = DAT_00b7e1b0;
    pOVar5 = Theory::getNonpolymorphicOperatorType(REAL_PLUS);
    uVar3 = Signature::getInterpretingSymbol(pSVar2,REAL_PLUS,pOVar5);
    *(uint *)&pEVar4[1]._vptr_Evaluator = uVar3;
    if ((this->_evals)._cursor == (this->_evals)._end) {
      ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
    }
    *(this->_evals)._cursor = pEVar4;
    pppEVar1 = &(this->_evals)._cursor;
    *pppEVar1 = *pppEVar1 + 1;
    pEVar4 = (Evaluator *)::operator_new(0x10);
    pEVar4->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_00b680d0;
    pSVar2 = DAT_00b7e1b0;
    pOVar5 = Theory::getNonpolymorphicOperatorType(REAL_MULTIPLY);
    uVar3 = Signature::getInterpretingSymbol(pSVar2,REAL_MULTIPLY,pOVar5);
    *(uint *)&pEVar4[1]._vptr_Evaluator = uVar3;
    if ((this->_evals)._cursor == (this->_evals)._end) {
      ::Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand(this_00);
    }
    *(this->_evals)._cursor = pEVar4;
    pppEVar1 = &(this->_evals)._cursor;
    *pppEVar1 = *pppEVar1 + 1;
  }
  ::Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::ensure(&this->_funEvaluators,0);
  ::Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::ensure(&this->_predEvaluators,0);
  return;
}

Assistant:

InterpretedLiteralEvaluator::InterpretedLiteralEvaluator(bool doNormalize) : _normalize(doNormalize)
{
  // For an evaluator to be used it must be pushed onto _evals
  // We search this list, calling canEvaluate on each evaluator
  // An invariant we want to maintain is that for any literal only one
  //  Evaluator will return true for canEvaluate
  _evals.push(new IntEvaluator());
  _evals.push(new RatEvaluator());
  _evals.push(new RealEvaluator());
  _evals.push(new ConversionEvaluator());
  _evals.push(new EqualityEvaluator());

  if(env.options->useACeval() && !env.options->alasca()){
    // Special AC evaluators are added to be tried first for Plus and Multiply
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::INT_PLUS>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::INT_MULTIPLY>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::RAT_PLUS>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::RAT_MULTIPLY>> ());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::REAL_PLUS>> ());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::REAL_MULTIPLY>> ());
  }

  _funEvaluators.ensure(0);
  _predEvaluators.ensure(0);

}